

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

bool helics::apps::addPotentialTargetVariations
               (ConnectionsList *connections,string *interfaceName,string *targetFieldName1,
               string *targetFieldName2,json *interface)

{
  char *pcVar1;
  bool bVar2;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 uVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,targetFieldName1,"_");
  std::operator+(&local_b0,&local_50,targetFieldName2);
  bVar2 = addPotentialTargets(connections,interfaceName,&local_b0,interface);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  uVar3 = extraout_AL;
  if (!bVar2) {
    std::operator+(&local_70,targetFieldName1,targetFieldName2);
    bVar2 = addPotentialTargets(connections,interfaceName,&local_70,interface);
    std::__cxx11::string::~string((string *)&local_70);
    uVar3 = extraout_AL_00;
    if (!bVar2) {
      pcVar1 = (targetFieldName2->_M_dataplus)._M_p;
      iVar4 = toupper((int)*pcVar1);
      *pcVar1 = (char)iVar4;
      std::operator+(&local_90,targetFieldName1,targetFieldName2);
      addPotentialTargets(connections,interfaceName,&local_90,interface);
      std::__cxx11::string::~string((string *)&local_90);
      uVar3 = extraout_AL_01;
    }
  }
  return (bool)uVar3;
}

Assistant:

static bool addPotentialTargetVariations(ConnectionsList& connections,
                                         const std::string& interfaceName,
                                         const std::string& targetFieldName1,
                                         std::string targetFieldName2,
                                         const nlohmann::json& interface)
{
    bool found = addPotentialTargets(connections,
                                     interfaceName,
                                     targetFieldName1 + "_" + targetFieldName2,
                                     interface);
    if (!found) {
        found = addPotentialTargets(connections,
                                    interfaceName,
                                    targetFieldName1 + targetFieldName2,
                                    interface);
    }
    if (!found) {
        targetFieldName2.front() = std::toupper(targetFieldName2.front());
        addPotentialTargets(connections,
                            interfaceName,
                            targetFieldName1 + targetFieldName2,
                            interface);
    }
    return found;
}